

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall TestETCaptureCoverageInternal::Run(TestETCaptureCoverageInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  *extraout_RDX;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  *extraout_RDX_00;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  *t;
  string local_a0;
  undefined8 local_80;
  undefined8 local_78;
  int local_70 [2];
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_68;
  
  local_80 = 0x100000000;
  local_78 = 0x400000002;
  local_70[0] = 0;
  local_68.m_list.first.second.m_t = local_70;
  pOVar1 = (this->super_Test).m_op;
  local_68.m_list.first.first.first.first.first.second.m_t = (int *)&local_68;
  local_68.m_list.first.first.first.first.first.first.first.first.second =
       "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
  ;
  local_68.m_list.first.first.first.first.first.first.first.second = 0x2a8;
  local_68.m_list.first.first.first.first.first.first.second = " (1+2 > 1+3 < 0 => ";
  local_68.m_list.first.first.first.first.second = " ";
  local_68.m_list.first.first.first.second = "<";
  local_68.m_list.first.first.second = " ";
  local_68.m_list.second = ")";
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
            (&local_a0,(testinator *)&local_68,
             (Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
              *)local_68.m_list.first.first.first.first.first.second.m_t);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_a0);
  t = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    t = extraout_RDX_00;
  }
  (this->super_Test).m_success = false;
  pOVar1 = (this->super_Test).m_op;
  local_68.m_list.first.first.first.first.first.first.first.first.second =
       "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
  ;
  local_68.m_list.first.first.first.first.first.first.first.second = 0x2a9;
  local_68.m_list.first.first.first.first.first.first.second = " (false => ";
  local_68.m_list.first.first.first.first.first.second.m_t =
       local_68.m_list.first.first.first.first.first.second.m_t & 0xffffffffffffff00;
  local_68.m_list.first.first.first.first.second = ")";
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
            (&local_a0,(testinator *)&local_68,t);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).m_success = false;
  return true;
}

Assistant:

virtual bool Run()
  {
    EXPECT(1+2 > 1+3 < 0);
    EXPECT(false);
    return true;
  }